

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O1

void __thiscall
icu_63::CalendarAstronomer::CalendarAstronomer
          (CalendarAstronomer *this,double longitude,double latitude)

{
  UDate UVar1;
  double dVar2;
  double dVar3;
  
  UVar1 = Calendar::getNow();
  this->fTime = UVar1;
  dVar2 = longitude * 0.017453292519943295 + 3.141592653589793;
  (this->moonPosition).ascension = 0.0;
  (this->moonPosition).declination = 0.0;
  this->moonPositionSet = '\0';
  dVar3 = uprv_floor_63(dVar2 / 6.283185307179586);
  this->fLongitude = dVar3 * -6.283185307179586 + dVar2 + -3.141592653589793;
  dVar2 = latitude * 0.017453292519943295 + 3.141592653589793;
  dVar3 = uprv_floor_63(dVar2 / 6.283185307179586);
  this->fLatitude = dVar3 * -6.283185307179586 + dVar2 + -3.141592653589793;
  this->fGmtOffset = (this->fLongitude * 24.0 * 3600000.0) / 6.283185307179586;
  dVar2 = uprv_getNaN_63();
  this->julianDay = dVar2;
  this->julianCentury = dVar2;
  this->sunLongitude = dVar2;
  this->meanAnomalySun = dVar2;
  this->moonLongitude = dVar2;
  this->moonEclipLong = dVar2;
  this->meanAnomalyMoon = dVar2;
  this->eclipObliquity = dVar2;
  this->siderealTime = dVar2;
  this->siderealT0 = dVar2;
  this->moonPositionSet = '\0';
  return;
}

Assistant:

CalendarAstronomer::CalendarAstronomer(double longitude, double latitude) :
  fTime(Calendar::getNow()), moonPosition(0,0), moonPositionSet(FALSE) {
  fLongitude = normPI(longitude * (double)DEG_RAD);
  fLatitude  = normPI(latitude  * (double)DEG_RAD);
  fGmtOffset = (double)(fLongitude * 24. * (double)HOUR_MS / (double)CalendarAstronomer_PI2);
  clearCache();
}